

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

bool read_file(string *path,string *output)

{
  byte bVar1;
  bool bVar2;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  undefined1 local_268 [12];
  undefined1 local_258 [12];
  undefined1 local_248 [16];
  undefined4 local_238;
  long local_228;
  ifstream ifs;
  string *output_local;
  string *path_local;
  
  std::ifstream::ifstream(&local_228,path,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  bVar2 = (bVar1 & 1) == 0;
  if (bVar2) {
    std::istream::seekg((long)&local_228,_S_beg);
    local_248 = std::istream::tellg();
    std::fpos::operator_cast_to_long((fpos *)local_248);
    std::__cxx11::string::reserve((ulong)output);
    std::istream::seekg((long)&local_228,_S_beg);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_258,
               (istream_type *)&local_228);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_268);
    __first._12_4_ = 0;
    __first._M_sbuf = (streambuf_type *)local_258._0_8_;
    __first._M_c = local_258._8_4_;
    __last._12_4_ = 0;
    __last._M_sbuf = (streambuf_type *)local_268._0_8_;
    __last._M_c = local_268._8_4_;
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)output,__first,__last);
  }
  local_238 = 1;
  std::ifstream::~ifstream(&local_228);
  return bVar2;
}

Assistant:

bool read_file(const std::string& path, std::string& output) {
  std::ifstream ifs(path);
  if(!ifs) {
    return false;
  }

  ifs.seekg(0, std::ios::end);
  output.reserve(ifs.tellg());
  ifs.seekg(0, std::ios::beg);

  output.assign((std::istreambuf_iterator<char>(ifs)), std::istreambuf_iterator<char>());
  return true;
}